

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsGetMetaDataTypeFromName(char *name,FmsMetaDataType *type)

{
  int iVar1;
  undefined4 *in_RSI;
  char *in_RDI;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 1;
  }
  else if (in_RSI == (undefined4 *)0x0) {
    local_4 = 2;
  }
  else {
    iVar1 = strcmp("FMS_INTEGER",in_RDI);
    if (iVar1 == 0) {
      *in_RSI = 0;
    }
    else {
      iVar1 = strcmp("FMS_SCALAR",in_RDI);
      if (iVar1 == 0) {
        *in_RSI = 1;
      }
      else {
        iVar1 = strcmp("FMS_STRING",in_RDI);
        if (iVar1 == 0) {
          *in_RSI = 2;
        }
        else {
          iVar1 = strcmp("FMS_META_DATA",in_RDI);
          if (iVar1 != 0) {
            return 3;
          }
          *in_RSI = 3;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FmsGetMetaDataTypeFromName(const char * const name, FmsMetaDataType *type) {
  if(!name) E_RETURN(1);
  if(!type) E_RETURN(2);

  if(strcmp(FmsMetaDataTypeNames[FMS_INTEGER], name) == 0)
    *type = FMS_INTEGER;
  else if(strcmp(FmsMetaDataTypeNames[FMS_SCALAR], name) == 0)
    *type = FMS_SCALAR;
  else if(strcmp(FmsMetaDataTypeNames[FMS_STRING], name) == 0)
    *type = FMS_STRING;
  else if(strcmp(FmsMetaDataTypeNames[FMS_META_DATA], name) == 0)
    *type = FMS_META_DATA;
  else
    E_RETURN(3);

  return 0;
}